

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

void __thiscall BackwardPass::RemoveEmptyLoopAfterMemOp(BackwardPass *this,Loop *loop)

{
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *pSVar1;
  IRKind IVar2;
  char cVar3;
  ushort uVar4;
  BasicBlock *this_00;
  LabelInstr *branchTarget;
  code *pcVar5;
  bool bVar6;
  BasicBlock *block;
  undefined4 *puVar7;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar8;
  Type *ppFVar9;
  BranchInstr *newInstr;
  long lVar10;
  BasicBlock *pBVar11;
  Func **ppFVar12;
  BasicBlock *block_00;
  Iterator local_50;
  BasicBlock *local_40;
  BasicBlock *local_38;
  
  block = Loop::GetHeadBlock(loop);
  local_40 = block->next;
  pSVar8 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
           (block->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
           super_SListNodeBase<Memory::ArenaAllocator>.next;
  this_00 = loop->landingPad;
  pSVar1 = &block->succList;
  if ((pSVar8 == &pSVar1->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>) ||
     ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)
      ((pSVar8->super_SListNodeBase<Memory::ArenaAllocator>).next)->next != pSVar1)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x241d,"(succList->HasTwo())","succList->HasTwo()");
    if (!bVar6) goto LAB_003eaf22;
    *puVar7 = 0;
    pSVar8 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
             (pSVar1->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>).
             super_SListNodeBase<Memory::ArenaAllocator>.next;
  }
  local_50.current =
       &((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0)->
        super_SListNodeBase<Memory::ArenaAllocator>;
  if (pSVar8 != &pSVar1->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>) {
    local_50.current = &pSVar8->super_SListNodeBase<Memory::ArenaAllocator>;
  }
  local_50.list = &pSVar1->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
  ppFVar9 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_50);
  block_00 = local_40;
  if ((*ppFVar9)->succBlock == local_40) {
    if ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_50.current ==
        (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar6) goto LAB_003eaf22;
      *puVar7 = 0;
    }
    pSVar8 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
             (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_50.current)->
             super_SListNodeBase<Memory::ArenaAllocator>).next;
    local_50.current =
         &((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0)->
          super_SListNodeBase<Memory::ArenaAllocator>;
    if (pSVar8 != local_50.list) {
      local_50.current = (NodeBase *)pSVar8;
    }
    ppFVar9 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_50);
    pBVar11 = (*ppFVar9)->succBlock;
  }
  else {
    ppFVar9 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_50);
    local_38 = (*ppFVar9)->succBlock;
    if ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_50.current ==
        (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar6) goto LAB_003eaf22;
      *puVar7 = 0;
    }
    pSVar8 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
             (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_50.current)->
             super_SListNodeBase<Memory::ArenaAllocator>).next;
    local_50.current =
         &((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0)->
          super_SListNodeBase<Memory::ArenaAllocator>;
    if (pSVar8 != local_50.list) {
      local_50.current = (NodeBase *)pSVar8;
    }
    ppFVar9 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_50);
    pBVar11 = local_38;
    if ((*ppFVar9)->succBlock != block_00) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x242c,"(iter.Data()->GetSucc() == tail)","iter.Data()->GetSucc() == tail"
                        );
      if (!bVar6) goto LAB_003eaf22;
      *puVar7 = 0;
      pBVar11 = local_38;
    }
  }
  BasicBlock::RemovePred(pBVar11,block,this->func->m_fg);
  BasicBlock::RemoveSucc(this_00,block,this->func->m_fg);
  if ((this_00->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
      super_RealCount.count != 0) {
    AssertCount = AssertCount + 1;
    local_38 = block;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x2432,"(landingPad->GetSuccList()->Count() == 0)",
                       "landingPad->GetSuccList()->Count() == 0");
    if (!bVar6) goto LAB_003eaf22;
    *puVar7 = 0;
    block = local_38;
  }
  branchTarget = (LabelInstr *)pBVar11->firstInstr;
  IVar2 = (branchTarget->super_Instr).m_kind;
  local_38 = pBVar11;
  if ((IVar2 == InstrKindProfiledLabel) || (IVar2 == InstrKindLabel)) {
    pBVar11 = this_00->next;
    ppFVar12 = (Func **)&pBVar11->firstInstr;
    if (pBVar11 == (BasicBlock *)0x0) {
      ppFVar12 = &this_00->func;
    }
    lVar10 = 0x18;
    if (pBVar11 == (BasicBlock *)0x0) {
      lVar10 = 0xd0;
    }
    lVar10 = *(long *)((long)&(*ppFVar12)->m_alloc + lVar10);
    cVar3 = *(char *)(lVar10 + 0x39);
    if ((((cVar3 == '\x02') || (cVar3 == '\a')) ||
        (uVar4 = *(ushort *)(lVar10 + 0x30), uVar4 - 0x23 < 3)) || (uVar4 - 0x173 < 2))
    goto LAB_003eadf2;
  }
  else {
LAB_003eadf2:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x2435,
                       "(firstOuterInstr->IsLabelInstr() && !landingPad->GetLastInstr()->EndsBasicBlock())"
                       ,
                       "firstOuterInstr->IsLabelInstr() && !landingPad->GetLastInstr()->EndsBasicBlock()"
                      );
    if (!bVar6) goto LAB_003eaf22;
    *puVar7 = 0;
    IVar2 = (branchTarget->super_Instr).m_kind;
    block_00 = local_40;
  }
  if ((IVar2 != InstrKindLabel) && (IVar2 != InstrKindProfiledLabel)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
    if (!bVar6) {
LAB_003eaf22:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar7 = 0;
    block_00 = local_40;
  }
  newInstr = IR::BranchInstr::New(Br,branchTarget,this->func);
  BasicBlock::InsertAfter(this_00,&newInstr->super_Instr);
  FlowGraph::AddEdge(this->func->m_fg,this_00,local_38);
  FlowGraph::RemoveBlock(this->func->m_fg,block,(GlobOpt *)0x0,false);
  if (block != block_00) {
    FlowGraph::RemoveBlock(this->func->m_fg,block_00,(GlobOpt *)0x0,false);
  }
  return;
}

Assistant:

void
BackwardPass::RemoveEmptyLoopAfterMemOp(Loop *loop)
{
    BasicBlock *head = loop->GetHeadBlock();
    BasicBlock *tail = head->next;
    BasicBlock *landingPad = loop->landingPad;
    BasicBlock *outerBlock = nullptr;
    SListBaseCounted<FlowEdge *> *succList = head->GetSuccList();
    Assert(succList->HasTwo());

    // Between the two successors of head, one is tail and the other one is the outerBlock
    SListBaseCounted<FlowEdge *>::Iterator  iter(succList);
    iter.Next();
    if (iter.Data()->GetSucc() == tail)
    {
        iter.Next();
        outerBlock = iter.Data()->GetSucc();
    }
    else
    {
        outerBlock = iter.Data()->GetSucc();
#ifdef DBG
        iter.Next();
        Assert(iter.Data()->GetSucc() == tail);
#endif
    }

    outerBlock->RemovePred(head, this->func->m_fg);
    landingPad->RemoveSucc(head, this->func->m_fg);
    Assert(landingPad->GetSuccList()->Count() == 0);

    IR::Instr* firstOuterInstr = outerBlock->GetFirstInstr();
    AssertOrFailFast(firstOuterInstr->IsLabelInstr() && !landingPad->GetLastInstr()->EndsBasicBlock());
    IR::LabelInstr* label = firstOuterInstr->AsLabelInstr();
    // Add br to Outer block to keep coherence between branches and flow graph
    IR::BranchInstr *outerBr = IR::BranchInstr::New(Js::OpCode::Br, label, this->func);
    landingPad->InsertAfter(outerBr);
    this->func->m_fg->AddEdge(landingPad, outerBlock);

    this->func->m_fg->RemoveBlock(head, nullptr);

    if (head != tail)
    {
        this->func->m_fg->RemoveBlock(tail, nullptr);
    }
}